

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

BinaryExpr<const_trng::vector<int,_2UL>_&,_const_trng::vector<int,_2UL>_&> * __thiscall
Catch::ExprLhs<trng::vector<int,2ul>const&>::operator==
          (ExprLhs<const_trng::vector<int,_2UL>_&> *this,vector<int,_2UL> *rhs)

{
  StringRef op;
  bool comparisonResult;
  vector<int,_2UL> *in_RSI;
  BinaryExpr<const_trng::vector<int,_2UL>_&,_const_trng::vector<int,_2UL>_&> *in_RDI;
  vector<int,_2UL> *in_stack_ffffffffffffffa8;
  undefined7 in_stack_ffffffffffffffb8;
  pointer piVar1;
  BinaryExpr<const_trng::vector<int,_2UL>_&,_const_trng::vector<int,_2UL>_&> *pBVar2;
  
  pBVar2 = in_RDI;
  comparisonResult =
       compareEqual<trng::vector<int,2ul>,trng::vector<int,2ul>>(in_RSI,in_stack_ffffffffffffffa8);
  piVar1 = (in_RSI->data).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  StringRef::StringRef
            ((StringRef *)in_RDI,(char *)CONCAT17(comparisonResult,in_stack_ffffffffffffffb8));
  op.m_size = (size_type)pBVar2;
  op.m_start = (char *)piVar1;
  BinaryExpr<const_trng::vector<int,_2UL>_&,_const_trng::vector<int,_2UL>_&>::BinaryExpr
            (in_RDI,comparisonResult,in_RSI,op,in_stack_ffffffffffffffa8);
  return pBVar2;
}

Assistant:

auto operator == ( RhsT const& rhs ) -> BinaryExpr<LhsT, RhsT const&> const {
            return { compareEqual( m_lhs, rhs ), m_lhs, "==", rhs };
        }